

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int archive_write_v7tar_finish_entry(archive_write *a)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  int ret;
  size_t unaff_retaddr;
  v7tar *v7tar;
  
  puVar1 = *(undefined8 **)(in_RDI + 0xd0);
  iVar2 = __archive_write_nulls((archive_write *)v7tar,unaff_retaddr);
  puVar1[1] = 0;
  *puVar1 = 0;
  return iVar2;
}

Assistant:

static int
archive_write_v7tar_finish_entry(struct archive_write *a)
{
	struct v7tar *v7tar;
	int ret;

	v7tar = (struct v7tar *)a->format_data;
	ret = __archive_write_nulls(a,
	    (size_t)(v7tar->entry_bytes_remaining + v7tar->entry_padding));
	v7tar->entry_bytes_remaining = v7tar->entry_padding = 0;
	return (ret);
}